

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O2

string * __thiscall
stackjit::Loader::getSignature_abi_cxx11_
          (string *__return_storage_ptr__,Loader *this,Function *function)

{
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_R8;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,(string *)this);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/svenslaggare[P]StackJIT/src/loader/loader.cpp:313:98)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/svenslaggare[P]StackJIT/src/loader/loader.cpp:313:98)>
             ::_M_manager;
  FunctionSignature::createSignature<std::__cxx11::string>
            (__return_storage_ptr__,(FunctionSignature *)local_38,(string *)(this + 0x40),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_58,in_R8);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Loader::getSignature(const Loader::Function& function) {
		return FunctionSignature::createSignature<std::string>(function.name(), function.parameters(), [](std::string str) { return str; });
	}